

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O1

void opj_t1_dec_sigpass_step_raw
               (opj_t1_t *t1,opj_flag_t *flagsp,OPJ_INT32 *datap,OPJ_INT32 oneplushalf,
               OPJ_UINT32 vsc,OPJ_UINT32 ci)

{
  byte bVar1;
  byte *pbVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  opj_mqc_t *mqc;
  uint *puVar6;
  OPJ_UINT32 OVar7;
  uint uVar8;
  bool bVar9;
  
  bVar3 = (char)ci * '\x03';
  if (((*flagsp >> (bVar3 & 0x1f) & 0x200010) != 0) || ((*flagsp >> (bVar3 & 0x1f) & 0x1ef) == 0)) {
    return;
  }
  if ((t1->mqc).ct == 0) {
    pbVar2 = (t1->mqc).bp;
    bVar1 = *pbVar2;
    if ((t1->mqc).c == 0xff) {
      if (0x8f < bVar1) {
        (t1->mqc).c = 0xff;
        goto LAB_0013e6ff;
      }
      (t1->mqc).c = (uint)bVar1;
      (t1->mqc).bp = pbVar2 + 1;
      OVar7 = 7;
    }
    else {
      (t1->mqc).c = (uint)bVar1;
      (t1->mqc).bp = pbVar2 + 1;
LAB_0013e6ff:
      OVar7 = 8;
    }
    (t1->mqc).ct = OVar7;
  }
  uVar4 = (t1->mqc).c;
  uVar8 = (t1->mqc).ct - 1;
  (t1->mqc).ct = uVar8;
  if ((uVar4 >> (uVar8 & 0x1f) & 1) == 0) goto LAB_0013e812;
  if (uVar8 == 0) {
    pbVar2 = (t1->mqc).bp;
    bVar1 = *pbVar2;
    if (uVar4 == 0xff) {
      if (0x8f < bVar1) {
        (t1->mqc).c = 0xff;
        goto LAB_0013e761;
      }
      (t1->mqc).c = (uint)bVar1;
      (t1->mqc).bp = pbVar2 + 1;
      OVar7 = 7;
    }
    else {
      (t1->mqc).c = (uint)bVar1;
      (t1->mqc).bp = pbVar2 + 1;
LAB_0013e761:
      OVar7 = 8;
    }
    (t1->mqc).ct = OVar7;
  }
  uVar4 = (t1->mqc).ct - 1;
  (t1->mqc).ct = uVar4;
  bVar9 = ((t1->mqc).c >> (uVar4 & 0x1f) & 1) != 0;
  uVar4 = (uint)bVar9;
  iVar5 = -oneplushalf;
  if (!bVar9) {
    iVar5 = oneplushalf;
  }
  *datap = iVar5;
  OVar7 = t1->w;
  flagsp[-1] = flagsp[-1] | 0x20 << (bVar3 & 0x1f);
  uVar8 = OVar7 + 2;
  *flagsp = *flagsp | (uVar4 << 0x13 | 0x10) << (bVar3 & 0x1f);
  flagsp[1] = flagsp[1] | 8 << (bVar3 & 0x1f);
  if (vsc == 0 && ci == 0) {
    puVar6 = flagsp + -(ulong)uVar8;
    *puVar6 = uVar4 << 0x1f | *puVar6 | 0x10000;
    *(byte *)((long)puVar6 + -2) = *(byte *)((long)puVar6 + -2) | 2;
    *(byte *)((long)puVar6 + 5) = *(byte *)((long)puVar6 + 5) | 0x80;
  }
  if (ci == 3) {
    flagsp[uVar8] = uVar4 << 0x12 | flagsp[uVar8] | 2;
    *(byte *)(flagsp + ((ulong)uVar8 - 1)) = (byte)flagsp[(ulong)uVar8 - 1] | 4;
    *(byte *)(flagsp + (ulong)uVar8 + 1) = (byte)flagsp[(ulong)uVar8 + 1] | 1;
  }
LAB_0013e812:
  *flagsp = *flagsp | 0x200000 << (bVar3 & 0x1f);
  return;
}

Assistant:

static INLINE void opj_t1_dec_sigpass_step_raw(
    opj_t1_t *t1,
    opj_flag_t *flagsp,
    OPJ_INT32 *datap,
    OPJ_INT32 oneplushalf,
    OPJ_UINT32 vsc,
    OPJ_UINT32 ci)
{
    OPJ_UINT32 v;
    opj_mqc_t *mqc = &(t1->mqc);       /* RAW component */

    OPJ_UINT32 const flags = *flagsp;

    if ((flags & ((T1_SIGMA_THIS | T1_PI_THIS) << (ci * 3U))) == 0U &&
            (flags & (T1_SIGMA_NEIGHBOURS << (ci * 3U))) != 0U) {
        if (opj_mqc_raw_decode(mqc)) {
            v = opj_mqc_raw_decode(mqc);
            *datap = v ? -oneplushalf : oneplushalf;
            opj_t1_update_flags(flagsp, ci, v, t1->w + 2, vsc);
        }
        *flagsp |= T1_PI_THIS << (ci * 3U);
    }
}